

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassSerializeBinary
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  int iVar1;
  long lVar2;
  long lVar3;
  _Alloc_hider this_00;
  Descriptor *in_R8;
  long lVar4;
  string local_70;
  string local_50;
  
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_70,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
             (GeneratorOptions *)(options->namespace_prefix)._M_string_length,desc);
  io::Printer::Print(printer,
                     "/**\n * Serializes the message to binary data (in protobuf wire format).\n * @return {!Uint8Array}\n */\n$class$.prototype.serializeBinary = function() {\n  var writer = new jspb.BinaryWriter();\n  $class$.serializeBinaryToWriter(this, writer);\n  return writer.getResultBuffer();\n};\n\n\n/**\n * Serializes the given message to binary data (in protobuf wire\n * format), writing to the given BinaryWriter.\n * @param {!$class$} message\n * @param {!jspb.BinaryWriter} writer\n */\n$class$.serializeBinaryToWriter = function(message, writer) {\n  var f = undefined;\n"
                     ,"class",&local_70);
  this_00._M_p = local_70._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (0 < *(int *)(desc + 0x2c)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      lVar2 = *(long *)(desc + 0x30);
      if (*(char *)(lVar2 + 0x50 + lVar3) == '\x01') {
        this_00._M_p = (pointer)**(undefined8 **)(*(long *)(lVar2 + 0x58 + lVar3) + 0x10);
        iVar1 = std::__cxx11::string::compare(this_00._M_p);
        if (iVar1 != 0) {
          lVar2 = *(long *)(desc + 0x30);
          goto LAB_002203ee;
        }
      }
      else {
LAB_002203ee:
        GenerateClassSerializeBinaryField
                  ((Generator *)this_00._M_p,options,printer,(FieldDescriptor *)(lVar2 + lVar3));
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0xa8;
    } while (lVar4 < *(int *)(desc + 0x2c));
  }
  if (0 < *(int *)(desc + 0x68)) {
    (anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
              (&local_70,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(desc + 0x10),
               (FileDescriptor *)desc,in_R8);
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
               (GeneratorOptions *)(options->namespace_prefix)._M_string_length,desc);
    io::Printer::Print(printer,
                       "  jspb.Message.serializeBinaryExtensions(message, writer,\n    $extobj$Binary, $class$.prototype.getExtension);\n"
                       ,"extobj",&local_70,"class",&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  io::Printer::Print(printer,"};\n\n\n");
  return;
}

Assistant:

void Generator::GenerateClassSerializeBinary(const GeneratorOptions& options,
                                             io::Printer* printer,
                                             const Descriptor* desc) const {
  printer->Print(
      "/**\n"
      " * Serializes the message to binary data (in protobuf wire format).\n"
      " * @return {!Uint8Array}\n"
      " */\n"
      "$class$.prototype.serializeBinary = function() {\n"
      "  var writer = new jspb.BinaryWriter();\n"
      "  $class$.serializeBinaryToWriter(this, writer);\n"
      "  return writer.getResultBuffer();\n"
      "};\n"
      "\n"
      "\n"
      "/**\n"
      " * Serializes the given message to binary data (in protobuf wire\n"
      " * format), writing to the given BinaryWriter.\n"
      " * @param {!$class$} message\n"
      " * @param {!jspb.BinaryWriter} writer\n"
      " */\n"
      "$class$.serializeBinaryToWriter = function(message, "
      "writer) {\n"
      "  var f = undefined;\n",
      "class", GetMessagePath(options, desc));

  for (int i = 0; i < desc->field_count(); i++) {
    if (!IgnoreField(desc->field(i))) {
      GenerateClassSerializeBinaryField(options, printer, desc->field(i));
    }
  }

  if (IsExtendable(desc)) {
    printer->Print(
        "  jspb.Message.serializeBinaryExtensions(message, writer,\n"
        "    $extobj$Binary, $class$.prototype.getExtension);\n",
        "extobj", JSExtensionsObjectName(options, desc->file(), desc),
        "class", GetMessagePath(options, desc));
  }

  printer->Print(
      "};\n"
      "\n"
      "\n");
}